

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

bool __thiscall
math::wide_integer::uintwide_t<48u,unsigned_short,void,false>::wr_string<char*>
          (uintwide_t<48u,unsigned_short,void,false> *this,char *str_result,uint_fast8_t base_rep,
          bool show_base,bool show_pos,bool is_uppercase,unsigned_fast_type field_width,
          char fill_char_str)

{
  undefined2 uVar1;
  bool bVar2;
  uintwide_t<24U,_unsigned_char,_void,_false> uVar3;
  uintwide_t<24U,_unsigned_char,_void,_false> *v;
  unsigned_fast_type uVar4;
  long lVar5;
  int iVar6;
  undefined7 in_register_00000011;
  ulong uVar7;
  uintwide_t<24U,_unsigned_char,_void,_false> t;
  byte local_68 [32];
  undefined4 local_48;
  undefined2 local_44;
  uintwide_t<24U,_unsigned_char,_void,_false> tmp;
  
  iVar6 = (int)CONCAT71(in_register_00000011,base_rep);
  if (iVar6 == 0x10) {
    _t = *(undefined4 *)this;
    local_68[0] = 0;
    local_68[1] = 0;
    local_68[2] = 0;
    local_68[3] = 0;
    local_68[4] = 0;
    local_68[5] = 0;
    local_68[6] = 0;
    local_68[7] = 0;
    local_68[8] = 0;
    local_68[9] = 0;
    local_68[10] = 0;
    local_68[0xb] = 0;
    local_68[0xc] = 0;
    local_68[0xd] = 0;
    local_68[0xe] = 0;
    local_68[0xf] = 0;
    local_68[0x10] = 0;
    local_68[0x11] = 0;
    local_68[0x12] = 0;
    local_68[0x13] = 0;
    bVar2 = uintwide_t<48U,_unsigned_short,_void,_false>::is_zero(&t);
    if (bVar2) {
      local_68[0x12] = 0x30;
      uVar7 = 0x12;
    }
    else {
      uVar4 = uintwide_t<48U,_unsigned_short,_void,_false>::extract_hex_digits<false,_nullptr>
                        (&t,(char *)(local_68 + 0x13),is_uppercase);
      uVar7 = 0x13 - uVar4;
    }
    if ((show_base) && (1 < (long)uVar7)) {
      local_68[(int)uVar7 - 1] = !is_uppercase << 5 | 0x58;
      uVar7 = uVar7 - 2;
      local_68[uVar7 & 0xffffffff] = 0x30;
    }
    if ((show_pos) && (0 < (long)uVar7)) {
      uVar7 = uVar7 - 1;
      local_68[uVar7 & 0xffffffff] = 0x2b;
    }
    if (field_width != 0) {
      lVar5 = 0;
      if (field_width < 0x14) {
        lVar5 = 0x13 - field_width;
      }
      while (lVar5 < (long)uVar7) {
        uVar7 = uVar7 - 1;
        local_68[uVar7 & 0xffffffff] = fill_char_str;
      }
    }
    local_68[0x13] = 0;
  }
  else if (iVar6 == 10) {
    uVar1 = *(undefined2 *)(this + 4);
    _t = *(undefined4 *)this;
    local_68[0] = 0;
    local_68[1] = 0;
    local_68[2] = 0;
    local_68[3] = 0;
    local_68[4] = 0;
    local_68[5] = 0;
    local_68[6] = 0;
    local_68[7] = 0;
    local_68[8] = 0;
    local_68[9] = 0;
    local_68[10] = 0;
    local_68[0xb] = 0;
    local_68[0xc] = 0;
    local_68[0xd] = 0;
    local_68[0xe] = 0;
    local_68[0xf] = 0;
    local_68[0x10] = 0;
    local_68[0x11] = 0;
    local_68[0x12] = 0;
    local_68[0x13] = 0;
    local_68[0x14] = 0;
    local_68[0x15] = 0;
    local_68[0x16] = 0;
    bVar2 = uintwide_t<48U,_unsigned_short,_void,_false>::is_zero(&t);
    if (bVar2) {
      local_68[0x16] = 0x30;
      uVar7 = 0x16;
    }
    else {
      uVar7 = 0x17;
      while ((bVar2 = uintwide_t<48U,_unsigned_short,_void,_false>::is_zero(&t), uVar7 != 0 &&
             (!bVar2))) {
        _tmp = _t;
        uintwide_t<48U,_unsigned_short,_void,_false>::eval_divide_by_single_limb
                  ((uintwide_t<48U,_unsigned_short,_void,_false> *)&t,10,0,
                   (uintwide_t<24U,_unsigned_char,_void,_false> *)0x0);
        local_48 = _t;
        local_44 = uVar1;
        v = uintwide_t<48U,_unsigned_short,_void,_false>::mul_by_limb
                      ((uintwide_t<48U,_unsigned_short,_void,_false> *)&local_48,10);
        uVar3 = wide_integer::operator-(&tmp,v);
        uVar7 = uVar7 - 1;
        local_68[uVar7 & 0xffffffff] = uVar3.values.super_array<unsigned_char,_3UL>.elems[0] + 0x30;
      }
    }
    if (show_pos && uVar7 != 0) {
      uVar7 = uVar7 - 1;
      local_68[uVar7 & 0xffffffff] = 0x2b;
    }
    if (field_width != 0) {
      lVar5 = 0;
      if (field_width < 0x18) {
        lVar5 = 0x17 - field_width;
      }
      while (lVar5 < (long)uVar7) {
        uVar7 = uVar7 - 1;
        local_68[uVar7 & 0xffffffff] = fill_char_str;
      }
    }
    local_68[0x17] = 0;
  }
  else {
    if (iVar6 != 8) {
      return false;
    }
    _t = *(undefined4 *)this;
    local_68[0] = 0;
    local_68[1] = 0;
    local_68[2] = 0;
    local_68[3] = 0;
    local_68[4] = 0;
    local_68[5] = 0;
    local_68[6] = 0;
    local_68[7] = 0;
    local_68[8] = 0;
    local_68[9] = 0;
    local_68[10] = 0;
    local_68[0xb] = 0;
    local_68[0xc] = 0;
    local_68[0xd] = 0;
    local_68[0xe] = 0;
    local_68[0xf] = 0;
    local_68[0x10] = 0;
    local_68[0x11] = 0;
    local_68[0x12] = 0;
    local_68[0x13] = 0;
    local_68[0x14] = 0;
    local_68[0x15] = 0;
    local_68[0x16] = 0;
    bVar2 = uintwide_t<48U,_unsigned_short,_void,_false>::is_zero(&t);
    if (bVar2) {
      local_68[0x16] = 0x30;
      uVar7 = 0x16;
    }
    else {
      uVar7 = 0x17;
      while ((bVar2 = uintwide_t<48U,_unsigned_short,_void,_false>::is_zero(&t), uVar7 != 0 &&
             (!bVar2))) {
        uVar7 = uVar7 - 1;
        local_68[uVar7 & 0xffffffff] = t.values.super_array<unsigned_char,_3UL>.elems[0] & 7 | 0x30;
        operator>>=((uintwide_t<48u,unsigned_short,void,false> *)&t,3);
      }
    }
    if (show_base && uVar7 != 0) {
      uVar7 = uVar7 - 1;
      local_68[uVar7 & 0xffffffff] = 0x30;
    }
    if (show_pos && uVar7 != 0) {
      uVar7 = uVar7 - 1;
      local_68[uVar7 & 0xffffffff] = 0x2b;
    }
    if (field_width != 0) {
      lVar5 = 0;
      if (field_width < 0x18) {
        lVar5 = 0x17 - field_width;
      }
      while (lVar5 < (long)uVar7) {
        uVar7 = uVar7 - 1;
        local_68[uVar7 & 0xffffffff] = fill_char_str;
      }
    }
    local_68[0x17] = 0;
  }
  detail::strcpy_unsafe<char*,char*>(str_result,(char *)(local_68 + uVar7));
  return true;
}

Assistant:

constexpr auto wr_string(      OutputStrIterator  str_result, // NOLINT(readability-function-cognitive-complexity)
                             const std::uint_fast8_t  base_rep      = static_cast<std::uint_fast8_t>(UINT8_C(0x10)),
                             const bool               show_base     = true,
                             const bool               show_pos      = false,
                             const bool               is_uppercase  = true,
                                   unsigned_fast_type field_width   = static_cast<unsigned_fast_type>(UINT8_C(0)),
                             const char               fill_char_str = '0') const -> bool
    {
      auto wr_string_is_ok = true;

      if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(8)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        const auto mask = static_cast<limb_type>(static_cast<std::uint8_t>(0x7U));

        using string_storage_oct_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_oct()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_oct(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_oct_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_oct_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_oct_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) })) // NOLINT(altera-id-dependent-backward-branch)
          {
            auto c = static_cast<char>(*t.values.cbegin() & mask);

            if(c <= static_cast<char>(INT8_C(8))) { c = static_cast<char>(c + static_cast<char>(INT8_C(0x30))); }

            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = c;

            t >>= static_cast<unsigned>(UINT8_C(3));
          }
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_oct_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(10)))
      {
        uintwide_t t(*this);

        const auto str_has_neg_sign = is_neg(t);

        if(str_has_neg_sign)
        {
          t.negate();
        }

        using string_storage_dec_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_dec()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_dec(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_dec_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_dec_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_dec_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) }))
          {
            const uintwide_t tmp(t);

            t.eval_divide_by_single_limb(static_cast<limb_type>(UINT8_C(10)), 0U, nullptr);

            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] =
              static_cast<char>
              (
                  static_cast<limb_type>
                  (
                    tmp - (uintwide_t(t).mul_by_limb(static_cast<limb_type>(UINT8_C(10))))
                  )
                + static_cast<limb_type>(UINT8_C(0x30))
              );
          }
        }

        if(pos > signed_fast_type { UINT8_C(0) })
        {
          if(show_pos && (!str_has_neg_sign))
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '+';
          }
          else if(str_has_neg_sign)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '-';
          }
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_dec_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(16)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        using string_storage_hex_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_hex()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_hex(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_hex_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_hex_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_hex_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }
        else
        {
          const auto dst =
            extract_hex_digits<false>
            (
              t,
              &str_temp[static_cast<typename string_storage_hex_type::size_type>(pos)],
              is_uppercase
            );

          pos -= static_cast<signed_fast_type>(dst);
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(1) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = (is_uppercase ? 'X' : 'x');

          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_hex_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else
      {
        wr_string_is_ok = false;
      }

      return wr_string_is_ok;
    }